

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int h2_session_send(Curl_easy *data,nghttp2_session *h2)

{
  HTTP *pHVar1;
  int iVar2;
  nghttp2_priority_spec pri_spec;
  nghttp2_priority_spec local_24;
  
  pHVar1 = (data->req).p.http;
  (data->conn->proto).httpc.trnsfr = data;
  if ((((data->set).stream_weight != (data->state).stream_weight) ||
      (((*(uint *)&(data->state).field_0x6d0 >> 0xc ^
        (uint)((ulong)*(undefined8 *)&(data->set).field_0x8e2 >> 0x2d)) & 1) != 0)) ||
     ((data->set).stream_depends_on != (data->state).stream_depends_on)) {
    h2_pri_spec(data,&local_24);
    iVar2 = nghttp2_submit_priority(h2,'\0',pHVar1->stream_id,&local_24);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  iVar2 = nghttp2_session_send(h2);
  return iVar2;
}

Assistant:

static int h2_session_send(struct Curl_easy *data,
                           nghttp2_session *h2)
{
  struct HTTP *stream = data->req.p.http;
  struct http_conn *httpc = &data->conn->proto.httpc;
  set_transfer(httpc, data);
  if((data->set.stream_weight != data->state.stream_weight) ||
     (data->set.stream_depends_e != data->state.stream_depends_e) ||
     (data->set.stream_depends_on != data->state.stream_depends_on) ) {
    /* send new weight and/or dependency */
    nghttp2_priority_spec pri_spec;
    int rv;

    h2_pri_spec(data, &pri_spec);

    H2BUGF(infof(data, "Queuing PRIORITY on stream %u (easy %p)",
                 stream->stream_id, data));
    DEBUGASSERT(stream->stream_id != -1);
    rv = nghttp2_submit_priority(h2, NGHTTP2_FLAG_NONE, stream->stream_id,
                                 &pri_spec);
    if(rv)
      return rv;
  }

  return nghttp2_session_send(h2);
}